

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O2

Vector * CGNIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                double OmegaPrecond)

{
  Boolean BVar1;
  LASErrIdType LVar2;
  size_t Dim;
  Vector *pVVar3;
  QMatrix *pQVar4;
  int iVar5;
  double bNorm;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double local_160;
  Vector r;
  Vector z;
  Vector s;
  Vector q;
  Vector p;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&r,"r",Dim,Normal,True);
  V_Constr(&p,"p",Dim,Normal,True);
  V_Constr(&q,"q",Dim,Normal,True);
  V_Constr(&z,"z",Dim,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Constr(&s,"s",Dim,Normal,True);
  }
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar6 = l1Norm_V(x);
    auVar8._8_4_ = (int)(Dim >> 0x20);
    auVar8._0_8_ = Dim;
    auVar8._12_4_ = 0x45300000;
    pVVar3 = b;
    if (2.2250738585072014e-307 <=
        ABS(dVar6 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar1 = Q_KerDefined(A);
      if (BVar1 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
    }
    Asgn_VV(&r,pVVar3);
    if ((PrecondProc == (PrecondProcType)0x0) && (BVar1 = Q_KerDefined(A), BVar1 == False)) {
      iVar5 = 0;
      local_160 = 0.0;
      while( true ) {
        dVar6 = l2Norm_V(&r);
        BVar1 = RTCResult(iVar5,dVar6,bNorm,CGNIterId);
        if ((BVar1 != False) || (MaxIter <= iVar5)) break;
        pQVar4 = Transp_Q(A);
        pVVar3 = Mul_QV(pQVar4,&r);
        Asgn_VV(&z,pVVar3);
        dVar6 = l2Norm_V(&z);
        dVar6 = dVar6 * dVar6;
        pVVar3 = &z;
        if (iVar5 != 0) {
          pVVar3 = Mul_SV(dVar6 / local_160,&p);
          pVVar3 = Add_VV(&z,pVVar3);
        }
        Asgn_VV(&p,pVVar3);
        pVVar3 = Mul_QV(A,&p);
        Asgn_VV(&q,pVVar3);
        dVar7 = l2Norm_V(&q);
        dVar7 = dVar6 / (dVar7 * dVar7);
        pVVar3 = Mul_SV(dVar7,&p);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(dVar7,&q);
        SubAsgn_VV(&r,pVVar3);
        iVar5 = iVar5 + 1;
        local_160 = dVar6;
      }
    }
    else {
      iVar5 = 0;
      local_160 = 0.0;
      while( true ) {
        dVar6 = l2Norm_V(&r);
        BVar1 = RTCResult(iVar5,dVar6,bNorm,CGNIterId);
        if ((BVar1 != False) || (MaxIter <= iVar5)) break;
        if (PrecondProc == (PrecondProcType)0x0) {
          pVVar3 = &r;
        }
        else {
          (*PrecondProc)(A,&z,&r,OmegaPrecond);
          pQVar4 = Transp_Q(A);
          (*PrecondProc)(pQVar4,&q,&z,OmegaPrecond);
          pQVar4 = Transp_Q(A);
          pVVar3 = Mul_QV(pQVar4,&q);
        }
        Asgn_VV(&z,pVVar3);
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ(&z,A);
        }
        dVar6 = l2Norm_V(&z);
        dVar6 = dVar6 * dVar6;
        pVVar3 = &z;
        if (iVar5 != 0) {
          pVVar3 = Mul_SV(dVar6 / local_160,&p);
          pVVar3 = Add_VV(&z,pVVar3);
        }
        Asgn_VV(&p,pVVar3);
        pVVar3 = Mul_QV(A,&p);
        Asgn_VV(&q,pVVar3);
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV(&s,&q);
        }
        else {
          (*PrecondProc)(A,&s,&q,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ(&s,A);
        }
        dVar7 = l2Norm_V(&s);
        dVar7 = dVar6 / (dVar7 * dVar7);
        pVVar3 = Mul_SV(dVar7,&p);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(dVar7,&q);
        SubAsgn_VV(&r,pVVar3);
        iVar5 = iVar5 + 1;
        local_160 = dVar6;
      }
    }
    BVar1 = Q_KerDefined(A);
    if (BVar1 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr(&r);
  V_Destr(&p);
  V_Destr(&q);
  V_Destr(&z);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Destr(&s);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *CGNIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, p, q, s, z;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    V_Constr(&z, "z", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&s, "s", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);
        
        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned CGN */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGNIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL) {
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
                    (*PrecondProc)(Transp_Q(A), &q, &z, OmegaPrecond);
                    Asgn_VV(&z, Mul_QV(Transp_Q(A), &q));
	        } else {
		    Asgn_VV(&z, &r);
		}
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z, A);
                Rho = pow(l2Norm_V(&z), 2.0);
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &s, &q, OmegaPrecond);
		else
		    Asgn_VV(&s, &q);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&s, A);
                Alpha = Rho / pow(l2Norm_V(&s), 2.0);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        } else {
            /* plain CGN */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGNIterId)
                && Iter < MaxIter) {
                Iter++;
                Asgn_VV(&z, Mul_QV(Transp_Q(A), &r));
                Rho = pow(l2Norm_V(&z), 2.0);
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / pow(l2Norm_V(&q), 2.0);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }
    
    V_Destr(&r);
    V_Destr(&p);
    V_Destr(&q);
    V_Destr(&z);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&s);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}